

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O0

void __thiscall SQFunctionProto::Finalize(SQFunctionProto *this)

{
  long in_RDI;
  SQInteger _n_;
  byte *this_00;
  
  for (this_00 = (byte *)0x0; (long)this_00 < *(long *)(in_RDI + 0x88);
      this_00 = (byte *)((long)&(((SQObjectPtr *)this_00)->super_SQObject)._type + 1)) {
    ::SQObjectPtr::Null((SQObjectPtr *)this_00);
  }
  return;
}

Assistant:

void Finalize(){ _NULL_SQOBJECT_VECTOR(_literals,_nliterals); }